

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::SourceLocationTable::Find
          (SourceLocationTable *this,Message *descriptor,ErrorLocation location,int *line,
          int *column)

{
  const_iterator cVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  key_type local_28;
  
  local_28.first = descriptor;
  local_28.second = location;
  cVar1 = std::
          _Rb_tree<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
          ::find((_Rb_tree<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
                  *)this,&local_28);
  p_Var3 = &(this->location_map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node == p_Var3) {
    *line = -1;
    iVar2 = 0;
  }
  else {
    *line = *(int *)&cVar1._M_node[1]._M_left;
    iVar2 = *(int *)((long)&cVar1._M_node[1]._M_left + 4);
  }
  *column = iVar2;
  return (_Rb_tree_header *)cVar1._M_node != p_Var3;
}

Assistant:

bool SourceLocationTable::Find(
    const Message* descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location, int* line,
    int* column) const {
  const std::pair<int, int>* result =
      FindOrNull(location_map_, std::make_pair(descriptor, location));
  if (result == NULL) {
    *line = -1;
    *column = 0;
    return false;
  } else {
    *line = result->first;
    *column = result->second;
    return true;
  }
}